

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

int Abc_NodeIsConst0(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk_00;
  Mio_Gate_t *pMVar1;
  int iVar2;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode_local;
  
  pNtk_00 = pNode->pNtk;
  iVar2 = Abc_NtkIsLogic(pNtk_00);
  if ((iVar2 == 0) && (iVar2 = Abc_NtkIsNetlist(pNtk_00), iVar2 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x376,"int Abc_NodeIsConst0(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsNode(pNode);
  if (iVar2 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x377,"int Abc_NodeIsConst0(Abc_Obj_t *)");
  }
  iVar2 = Abc_NodeIsConst(pNode);
  if (iVar2 == 0) {
    pNode_local._4_4_ = 0;
  }
  else {
    iVar2 = Abc_NtkHasSop(pNtk_00);
    if (iVar2 == 0) {
      iVar2 = Abc_NtkHasBdd(pNtk_00);
      if (iVar2 == 0) {
        iVar2 = Abc_NtkHasAig(pNtk_00);
        if (iVar2 == 0) {
          iVar2 = Abc_NtkHasMapping(pNtk_00);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                          ,900,"int Abc_NodeIsConst0(Abc_Obj_t *)");
          }
          pMVar1 = (Mio_Gate_t *)(pNode->field_5).pData;
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pMVar3 = Mio_LibraryReadConst0(pLib);
          pNode_local._4_4_ = (uint)(pMVar1 == pMVar3);
        }
        else {
          iVar2 = Hop_IsComplement((Hop_Obj_t *)(pNode->field_5).pData);
          pNode_local._4_4_ = (uint)(iVar2 != 0);
        }
      }
      else {
        pNode_local._4_4_ = (pNode->field_5).iData & 1;
      }
    }
    else {
      pNode_local._4_4_ = Abc_SopIsConst0((char *)(pNode->field_5).pData);
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeIsConst0( Abc_Obj_t * pNode )    
{ 
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) );      
    if ( !Abc_NodeIsConst(pNode) )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
        return Abc_SopIsConst0((char *)pNode->pData);
#ifdef ABC_USE_CUDD
    if ( Abc_NtkHasBdd(pNtk) )
        return Cudd_IsComplement(pNode->pData);
#endif
    if ( Abc_NtkHasAig(pNtk) )
        return Hop_IsComplement((Hop_Obj_t *)pNode->pData)? 1:0;
    if ( Abc_NtkHasMapping(pNtk) )
        return pNode->pData == Mio_LibraryReadConst0((Mio_Library_t *)Abc_FrameReadLibGen());
    assert( 0 );
    return 0;
}